

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

void emit_ARB1_dest_modifiers(Context *ctx)

{
  bool bVar1;
  uint *in_RDX;
  uint *extraout_RDX;
  size_t buflen;
  char *pcVar2;
  char dst [64];
  char var [64];
  char acStack_98 [64];
  char local_58 [64];
  
  if ((ctx->dest_arg).result_shift == 0) goto LAB_0011dbc4;
  make_ARB1_destarg_string(ctx,acStack_98,(size_t)in_RDX);
  bVar1 = true;
  pcVar2 = (char *)0x0;
  in_RDX = &switchD_0011db5e::switchdataD_001353f4;
  switch((ctx->dest_arg).result_shift) {
  case 1:
    pcVar2 = "2.0";
    break;
  case 2:
    pcVar2 = "4.0";
    break;
  case 3:
    pcVar2 = "8.0";
    break;
  default:
    goto switchD_0011db5e_caseD_4;
  case 0xd:
    pcVar2 = "0.125";
    break;
  case 0xe:
    pcVar2 = "0.25";
    break;
  case 0xf:
    pcVar2 = "0.5";
  }
  bVar1 = false;
switchD_0011db5e_caseD_4:
  if (!bVar1) {
    get_ARB1_destarg_varname(ctx,local_58,(size_t)in_RDX);
    output_line(ctx,"MUL%s, %s, %s;",acStack_98,local_58,pcVar2);
    in_RDX = extraout_RDX;
  }
LAB_0011dbc4:
  if (((((ctx->dest_arg).result_mod & 1) != 0) && (ctx->profile_supports_nv4 == 0)) &&
     (ctx->shader_type != MOJOSHADER_TYPE_PIXEL)) {
    get_ARB1_destarg_varname(ctx,acStack_98,(size_t)in_RDX);
    make_ARB1_destarg_string(ctx,local_58,buflen);
    output_line(ctx,"MIN%s, %s, 1.0;",local_58,acStack_98);
    output_line(ctx,"MAX%s, %s, 0.0;",local_58,acStack_98);
  }
  return;
}

Assistant:

static void emit_ARB1_dest_modifiers(Context *ctx)
{
    const DestArgInfo *arg = &ctx->dest_arg;

    if (arg->result_shift != 0x0)
    {
        char dst[64]; make_ARB1_destarg_string(ctx, dst, sizeof (dst));
        const char *multiplier = NULL;

        switch (arg->result_shift)
        {
            case 0x1: multiplier = "2.0"; break;
            case 0x2: multiplier = "4.0"; break;
            case 0x3: multiplier = "8.0"; break;
            case 0xD: multiplier = "0.125"; break;
            case 0xE: multiplier = "0.25"; break;
            case 0xF: multiplier = "0.5"; break;
        } // switch

        if (multiplier != NULL)
        {
            char var[64]; get_ARB1_destarg_varname(ctx, var, sizeof (var));
            output_line(ctx, "MUL%s, %s, %s;", dst, var, multiplier);
        } // if
    } // if

    if (arg->result_mod & MOD_SATURATE)
    {
        // nv4 and/or pixel shaders just used the "SAT" modifier, instead.
        if ( (!support_nv4(ctx)) && (!shader_is_pixel(ctx)) )
        {
            char var[64]; get_ARB1_destarg_varname(ctx, var, sizeof (var));
            char dst[64]; make_ARB1_destarg_string(ctx, dst, sizeof (dst));
            output_line(ctx, "MIN%s, %s, 1.0;", dst, var);
            output_line(ctx, "MAX%s, %s, 0.0;", dst, var);
        } // if
    } // if
}